

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  TPMI_DH_OBJECT TVar2;
  UINT32 UVar3;
  TPM_RC TVar4;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar4 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    *target = UVar3;
    *buffer = *buffer + 4;
    TVar2 = *target;
    if (TVar2 == 0x40000007) {
      TVar4 = 0x84;
      if (flag != 0) {
        TVar4 = 0;
      }
    }
    else {
      TVar4 = 0x84;
      if (0xfeffffff < TVar2 + 0x7e000000) {
        TVar4 = 0;
      }
      if ((int)TVar2 < -0x7ffffffd) {
        TVar4 = 0;
      }
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMI_DH_OBJECT_Unmarshal(TPMI_DH_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
   if (*target == TPM_RH_NULL) {
        if(flag)
            return TPM_RC_SUCCESS;
        else
            return TPM_RC_VALUE;
    }
    if(((*target < TRANSIENT_FIRST) || (*target > TRANSIENT_LAST))
      &&((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST)))
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}